

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uid.cpp
# Opt level: O1

bool fs_stdin_tty(void)

{
  int iVar1;
  
  iVar1 = fileno(_stdin);
  iVar1 = isatty(iVar1);
  return iVar1 != 0;
}

Assistant:

bool fs_stdin_tty()
{
// detect if stdin is connected to a terminal
  return
#ifdef _WIN32
    _isatty(_fileno(stdin));
#else
    isatty(fileno(stdin));
#endif
}